

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-alloc-cb-fail.c
# Opt level: O0

void connection_cb(uv_stream_t *server,int status)

{
  undefined1 local_28 [8];
  uv_buf_t buf;
  int r;
  int status_local;
  uv_stream_t *server_local;
  
  buf.len._4_4_ = status;
  if (server != (uv_stream_t *)&tcp_server) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x30,"server == (uv_stream_t*)&tcp_server");
    abort();
  }
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x31,"status == 0");
    abort();
  }
  buf.len._0_4_ = uv_tcp_init(tcp_server.loop,&tcp_peer);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x34,"r == 0");
    abort();
  }
  buf.len._0_4_ = uv_accept((uv_stream_t *)&tcp_server,(uv_stream_t *)&tcp_peer);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x37,"r == 0");
    abort();
  }
  buf.len._0_4_ = uv_read_start((uv_stream_t *)&tcp_peer,alloc_cb,read_cb);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x3a,"r == 0");
    abort();
  }
  local_28 = (undefined1  [8])0x1b93c8;
  buf.base = (char *)0x6;
  buf.len._0_4_ = uv_write(&write_req,(uv_stream_t *)&tcp_peer,(uv_buf_t *)local_28,1,write_cb);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x40,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void connection_cb(uv_stream_t* tcp, int status) {
  ASSERT(status == 0);

  ASSERT(0 == uv_tcp_init(tcp->loop, &incoming));
  ASSERT(0 == uv_accept(tcp, (uv_stream_t*) &incoming));
  ASSERT(0 == uv_read_start((uv_stream_t*) &incoming,
                            conn_alloc_cb,
                            conn_read_cb));

  connection_cb_called++;
}